

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_hpf_process_pcm_frames
                    (ma_hpf *pHPF,void *pFramesOut,void *pFramesIn,ma_uint64 frameCount)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ma_hpf1 *pmVar12;
  ma_biquad_coefficient *pmVar13;
  ma_hpf2 *pmVar14;
  ma_result mVar15;
  ulong uVar16;
  long lVar17;
  undefined2 uVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  float *pFramesInF32;
  ulong uVar25;
  ma_int16 *pFramesOutS16;
  float fVar26;
  float fVar27;
  float fVar28;
  
  if (pHPF == (ma_hpf *)0x0) {
    return MA_INVALID_ARGS;
  }
  if (pFramesOut == pFramesIn) {
    if (pHPF->hpf1Count != 0) {
      lVar17 = 0;
      uVar25 = 0;
      do {
        mVar15 = ma_hpf1_process_pcm_frames
                           ((ma_hpf1 *)((long)&pHPF->pHPF1->format + lVar17),pFramesOut,pFramesOut,
                            frameCount);
        if (mVar15 != MA_SUCCESS) {
          return mVar15;
        }
        uVar25 = uVar25 + 1;
        lVar17 = lVar17 + 0x28;
      } while (uVar25 < pHPF->hpf1Count);
    }
    if (pHPF->hpf2Count != 0) {
      lVar17 = 0;
      uVar25 = 0;
      do {
        if (pHPF->pHPF2 == (ma_hpf2 *)0x0) {
          mVar15 = MA_INVALID_ARGS;
        }
        else {
          mVar15 = ma_biquad_process_pcm_frames
                             ((ma_biquad *)((long)&(pHPF->pHPF2->bq).format + lVar17),pFramesOut,
                              pFramesOut,frameCount);
        }
        if (mVar15 != MA_SUCCESS) {
          return mVar15;
        }
        uVar25 = uVar25 + 1;
        lVar17 = lVar17 + 0x40;
      } while (uVar25 < pHPF->hpf2Count);
    }
    if (pFramesOut == pFramesIn) {
      return MA_SUCCESS;
    }
  }
  if (pHPF->format == ma_format_f32) {
    if (frameCount != 0) {
      uVar25 = 0;
      do {
        memcpy(pFramesOut,pFramesIn,(ulong)((&DAT_0017d490)[pHPF->format] * pHPF->channels));
        if (pHPF->hpf1Count != 0) {
          uVar16 = 0;
          do {
            pmVar12 = pHPF->pHPF1;
            uVar6 = pmVar12[uVar16].channels;
            fVar26 = 1.0 - pmVar12[uVar16].a.f32;
            uVar20 = 0;
            do {
              pmVar13 = pmVar12[uVar16].pR1;
              fVar27 = *(float *)((long)pFramesOut + uVar20 * 4) * (1.0 - fVar26) +
                       pmVar13[uVar20].f32 * -fVar26;
              *(float *)((long)pFramesOut + uVar20 * 4) = fVar27;
              pmVar13[uVar20].f32 = fVar27;
              uVar20 = uVar20 + 1;
            } while (uVar6 != uVar20);
            uVar16 = uVar16 + 1;
          } while (uVar16 < pHPF->hpf1Count);
        }
        if (pHPF->hpf2Count != 0) {
          uVar16 = 0;
          do {
            pmVar14 = pHPF->pHPF2;
            uVar6 = pmVar14[uVar16].bq.channels;
            fVar26 = pmVar14[uVar16].bq.b0.f32;
            fVar27 = pmVar14[uVar16].bq.b1.f32;
            fVar1 = pmVar14[uVar16].bq.b2.f32;
            fVar2 = pmVar14[uVar16].bq.a1.f32;
            fVar3 = pmVar14[uVar16].bq.a2.f32;
            uVar20 = 0;
            do {
              pmVar13 = pmVar14[uVar16].bq.pR1;
              fVar4 = *(float *)((long)pFramesOut + uVar20 * 4);
              fVar28 = fVar26 * fVar4 + pmVar13[uVar20].f32;
              fVar5 = pmVar14[uVar16].bq.pR2[uVar20].f32;
              *(float *)((long)pFramesOut + uVar20 * 4) = fVar28;
              pmVar13[uVar20].f32 = fVar27 * fVar4 + fVar28 * -fVar2 + fVar5;
              pmVar14[uVar16].bq.pR2[uVar20].f32 = fVar4 * fVar1 + fVar28 * -fVar3;
              uVar20 = uVar20 + 1;
            } while (uVar6 != uVar20);
            uVar16 = uVar16 + 1;
          } while (uVar16 < pHPF->hpf2Count);
        }
        pFramesOut = (void *)((long)pFramesOut + (ulong)pHPF->channels * 4);
        pFramesIn = (void *)((long)pFramesIn + (ulong)pHPF->channels * 4);
        uVar25 = (ulong)((int)uVar25 + 1);
      } while (uVar25 < frameCount);
    }
  }
  else {
    if (pHPF->format != ma_format_s16) {
      return MA_INVALID_OPERATION;
    }
    if (frameCount != 0) {
      uVar25 = 0;
      do {
        memcpy(pFramesOut,pFramesIn,(ulong)((&DAT_0017d490)[pHPF->format] * pHPF->channels));
        if (pHPF->hpf1Count != 0) {
          uVar16 = 0;
          do {
            pmVar12 = pHPF->pHPF1;
            uVar6 = pmVar12[uVar16].channels;
            iVar7 = pmVar12[uVar16].a.s32;
            uVar20 = 0;
            do {
              pmVar13 = pmVar12[uVar16].pR1;
              iVar21 = pmVar13[uVar20].s32 * (iVar7 + -0x4000) +
                       *(short *)((long)pFramesOut + uVar20 * 2) * iVar7 >> 0xe;
              *(short *)((long)pFramesOut + uVar20 * 2) = (short)iVar21;
              pmVar13[uVar20].s32 = iVar21;
              uVar20 = uVar20 + 1;
            } while (uVar6 != uVar20);
            uVar16 = uVar16 + 1;
          } while (uVar16 < pHPF->hpf1Count);
        }
        if (pHPF->hpf2Count != 0) {
          uVar16 = 0;
          do {
            pmVar14 = pHPF->pHPF2;
            uVar6 = pmVar14[uVar16].bq.channels;
            iVar7 = pmVar14[uVar16].bq.b0.s32;
            iVar21 = pmVar14[uVar16].bq.b1.s32;
            iVar8 = pmVar14[uVar16].bq.b2.s32;
            iVar9 = pmVar14[uVar16].bq.a1.s32;
            iVar10 = pmVar14[uVar16].bq.a2.s32;
            uVar20 = 0;
            do {
              pmVar13 = pmVar14[uVar16].bq.pR1;
              iVar24 = (int)*(short *)((long)pFramesOut + uVar20 * 2);
              iVar11 = pmVar14[uVar16].bq.pR2[uVar20].s32;
              iVar19 = iVar7 * iVar24 + pmVar13[uVar20].s32 >> 0xe;
              iVar22 = iVar9 * iVar19;
              iVar23 = iVar19 * iVar10;
              if (0x7ffe < iVar19) {
                iVar19 = 0x7fff;
              }
              uVar18 = (undefined2)iVar19;
              if (iVar19 < -0x7fff) {
                uVar18 = 0x8000;
              }
              *(undefined2 *)((long)pFramesOut + uVar20 * 2) = uVar18;
              pmVar13[uVar20].s32 = (iVar21 * iVar24 + iVar11) - iVar22;
              pmVar14[uVar16].bq.pR2[uVar20].s32 = iVar24 * iVar8 - iVar23;
              uVar20 = uVar20 + 1;
            } while (uVar6 != uVar20);
            uVar16 = uVar16 + 1;
          } while (uVar16 < pHPF->hpf2Count);
        }
        pFramesOut = (void *)((long)pFramesOut + (ulong)pHPF->channels * 2);
        pFramesIn = (void *)((long)pFramesIn + (ulong)pHPF->channels * 2);
        uVar25 = (ulong)((int)uVar25 + 1);
      } while (uVar25 < frameCount);
    }
  }
  return MA_SUCCESS;
}

Assistant:

MA_API ma_result ma_hpf_process_pcm_frames(ma_hpf* pHPF, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    ma_result result;
    ma_uint32 ihpf1;
    ma_uint32 ihpf2;

    if (pHPF == NULL) {
        return MA_INVALID_ARGS;
    }

    /* Faster path for in-place. */
    if (pFramesOut == pFramesIn) {
        for (ihpf1 = 0; ihpf1 < pHPF->hpf1Count; ihpf1 += 1) {
            result = ma_hpf1_process_pcm_frames(&pHPF->pHPF1[ihpf1], pFramesOut, pFramesOut, frameCount);
            if (result != MA_SUCCESS) {
                return result;
            }
        }

        for (ihpf2 = 0; ihpf2 < pHPF->hpf2Count; ihpf2 += 1) {
            result = ma_hpf2_process_pcm_frames(&pHPF->pHPF2[ihpf2], pFramesOut, pFramesOut, frameCount);
            if (result != MA_SUCCESS) {
                return result;
            }
        }
    }

    /* Slightly slower path for copying. */
    if (pFramesOut != pFramesIn) {
        ma_uint32 iFrame;

        /*  */ if (pHPF->format == ma_format_f32) {
            /* */ float* pFramesOutF32 = (      float*)pFramesOut;
            const float* pFramesInF32  = (const float*)pFramesIn;

            for (iFrame = 0; iFrame < frameCount; iFrame += 1) {
                MA_COPY_MEMORY(pFramesOutF32, pFramesInF32, ma_get_bytes_per_frame(pHPF->format, pHPF->channels));

                for (ihpf1 = 0; ihpf1 < pHPF->hpf1Count; ihpf1 += 1) {
                    ma_hpf1_process_pcm_frame_f32(&pHPF->pHPF1[ihpf1], pFramesOutF32, pFramesOutF32);
                }

                for (ihpf2 = 0; ihpf2 < pHPF->hpf2Count; ihpf2 += 1) {
                    ma_hpf2_process_pcm_frame_f32(&pHPF->pHPF2[ihpf2], pFramesOutF32, pFramesOutF32);
                }

                pFramesOutF32 += pHPF->channels;
                pFramesInF32  += pHPF->channels;
            }
        } else if (pHPF->format == ma_format_s16) {
            /* */ ma_int16* pFramesOutS16 = (      ma_int16*)pFramesOut;
            const ma_int16* pFramesInS16  = (const ma_int16*)pFramesIn;

            for (iFrame = 0; iFrame < frameCount; iFrame += 1) {
                MA_COPY_MEMORY(pFramesOutS16, pFramesInS16, ma_get_bytes_per_frame(pHPF->format, pHPF->channels));

                for (ihpf1 = 0; ihpf1 < pHPF->hpf1Count; ihpf1 += 1) {
                    ma_hpf1_process_pcm_frame_s16(&pHPF->pHPF1[ihpf1], pFramesOutS16, pFramesOutS16);
                }

                for (ihpf2 = 0; ihpf2 < pHPF->hpf2Count; ihpf2 += 1) {
                    ma_hpf2_process_pcm_frame_s16(&pHPF->pHPF2[ihpf2], pFramesOutS16, pFramesOutS16);
                }

                pFramesOutS16 += pHPF->channels;
                pFramesInS16  += pHPF->channels;
            }
        } else {
            MA_ASSERT(MA_FALSE);
            return MA_INVALID_OPERATION;    /* Should never hit this. */
        }
    }

    return MA_SUCCESS;
}